

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  _Rb_tree_node_base *p_Var2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  pointer __dest;
  const_iterator cVar7;
  char *pcVar8;
  _Rb_tree_node_base *p_Var9;
  undefined8 extraout_RAX;
  _Rb_tree_header *p_Var10;
  size_t sVar11;
  ostream *poVar12;
  char *pcVar13;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar14;
  Message errors;
  String name;
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  tests;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  _Rb_tree_node_base *local_b0;
  String local_a8;
  TypedTestCasePState *local_98;
  string local_90;
  uint local_6c;
  internal *local_68;
  _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  local_60;
  
  *this = (TypedTestCasePState)0x1;
  pcVar13 = registered_tests + -1;
  local_98 = this;
  local_6c = line;
  local_68 = (internal *)file;
  do {
    pbVar1 = (byte *)(pcVar13 + 1);
    pcVar13 = pcVar13 + 1;
    iVar5 = isspace((uint)*pbVar1);
  } while (iVar5 != 0);
  Message::Message((Message *)&local_b8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = (_Rb_tree_node_base *)(local_98 + 0x10);
  pcVar8 = pcVar13;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pcVar6 = strchr(pcVar8,0x2c);
    if (pcVar6 == (char *)0x0) {
      String::String((String *)&local_90,pcVar8);
    }
    else {
      sVar11 = (long)pcVar6 - (long)pcVar8;
      __dest = (pointer)operator_new__(sVar11 + 1);
      memcpy(__dest,pcVar8,sVar11);
      __dest[sVar11] = '\0';
      local_90._M_dataplus._M_p = __dest;
      local_90._M_string_length = sVar11;
    }
    cVar7 = std::
            _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
            ::find(&local_60,(key_type *)&local_90);
    p_Var2 = local_b0;
    p_Var10 = &local_60._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar7._M_node == p_Var10) {
      for (p_Var9 = *(_Rb_tree_node_base **)(local_98 + 0x20); p_Var9 != p_Var2;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        bVar4 = String::operator==((String *)&local_90,*(char **)(p_Var9 + 1));
        if (bVar4) {
          std::
          _Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
          ::_M_insert_unique<testing::internal::String_const&>
                    ((_Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
                      *)&local_60,(String *)&local_90);
          goto LAB_00169793;
        }
      }
      poVar12 = (ostream *)local_b8.ptr_ + 0x10;
      if (local_b8.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar12 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"No test named ",0xe);
      _Var3._M_p = local_90._M_dataplus._M_p;
      poVar12 = (ostream *)(local_b8.ptr_ + 0x10);
      if (local_b8.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar12 = (ostream *)0x0;
      }
      if (local_90._M_dataplus._M_p == (pointer)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(null)",6);
      }
      else if (local_90._M_string_length != 0) {
        sVar11 = 0;
        do {
          if (_Var3._M_p[sVar11] == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\\0",2);
          }
          else {
            local_a8.c_str_._0_1_ = _Var3._M_p[sVar11];
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_a8,1);
          }
          sVar11 = sVar11 + 1;
        } while (sVar11 != local_90._M_string_length);
      }
      poVar12 = (ostream *)(local_b8.ptr_ + 0x10);
      if (local_b8.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar12 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," can be found in this test case.\n",0x21);
    }
    else {
      poVar12 = (ostream *)(local_b8.ptr_ + 0x10);
      if (local_b8.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar12 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Test ",5);
      _Var3._M_p = local_90._M_dataplus._M_p;
      poVar12 = (ostream *)(local_b8.ptr_ + 0x10);
      if (local_b8.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar12 = (ostream *)0x0;
      }
      if (local_90._M_dataplus._M_p == (pointer)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(null)",6);
      }
      else if (local_90._M_string_length != 0) {
        sVar11 = 0;
        do {
          if (_Var3._M_p[sVar11] == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\\0",2);
          }
          else {
            local_a8.c_str_._0_1_ = _Var3._M_p[sVar11];
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_a8,1);
          }
          sVar11 = sVar11 + 1;
        } while (sVar11 != local_90._M_string_length);
      }
      poVar12 = (ostream *)(local_b8.ptr_ + 0x10);
      if (local_b8.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar12 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," is listed more than once.\n",0x1b);
    }
LAB_00169793:
    if (local_90._M_dataplus._M_p != (pointer)0x0) {
      operator_delete__(local_90._M_dataplus._M_p);
    }
    pcVar8 = strchr(pcVar8,0x2c);
    p_Var2 = local_b0;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar5 = isspace((uint)*pbVar1);
      } while (iVar5 != 0);
    }
    iVar5 = (int)p_Var10;
    if (pcVar8 == (char *)0x0) {
      p_Var9 = *(_Rb_tree_node_base **)(local_98 + 0x20);
      if (p_Var9 != p_Var2) {
        do {
          String::String((String *)&local_90,*(char **)(p_Var9 + 1));
          cVar7 = std::
                  _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                  ::find(&local_60,(key_type *)&local_90);
          if (local_90._M_dataplus._M_p != (pointer)0x0) {
            operator_delete__(local_90._M_dataplus._M_p);
          }
          if ((_Rb_tree_header *)cVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
            poVar12 = (ostream *)(local_b8.ptr_ + 0x10);
            if (local_b8.ptr_ ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              poVar12 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"You forgot to list test ",0x18);
            pcVar8 = *(char **)(p_Var9 + 1);
            if (pcVar8 == (char *)0x0) {
              sVar14.ptr_ = local_b8.ptr_ + 0x10;
              sVar11 = 6;
              pcVar8 = "(null)";
            }
            else {
              sVar14.ptr_ = local_b8.ptr_;
              if (local_b8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                sVar14.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)(local_b8.ptr_ + 0x10);
              }
              sVar11 = strlen(pcVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar14.ptr_,pcVar8,sVar11)
            ;
            poVar12 = (ostream *)(local_b8.ptr_ + 0x10);
            if (local_b8.ptr_ ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              poVar12 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          iVar5 = (int)p_Var10;
        } while (p_Var9 != local_b0);
      }
      StringStreamToString((internal *)&local_a8,local_b8.ptr_);
      bVar4 = String::operator==(&local_a8,"");
      if (bVar4) {
        if ((void *)CONCAT71(local_a8.c_str_._1_7_,(char)local_a8.c_str_) != (void *)0x0) {
          operator_delete__((void *)CONCAT71(local_a8.c_str_._1_7_,(char)local_a8.c_str_));
        }
        std::
        _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
        ::~_Rb_tree(&local_60);
        if (local_b8.ptr_ != (stringstream *)0x0) {
          (**(code **)(*(long *)local_b8.ptr_ + 8))();
        }
        return pcVar13;
      }
      FormatFileLocation_abi_cxx11_(&local_90,local_68,(char *)(ulong)local_6c,iVar5);
      VerifyRegisteredTestNames();
      if ((void *)CONCAT71(local_a8.c_str_._1_7_,(char)local_a8.c_str_) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_a8.c_str_._1_7_,(char)local_a8.c_str_));
      }
      std::
      _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
      ::~_Rb_tree(&local_60);
      if (local_b8.ptr_ != (stringstream *)0x0) {
        (**(code **)(*(long *)local_b8.ptr_ + 8))();
        local_b8.ptr_ = (stringstream *)0x0;
      }
      _Unwind_Resume(extraout_RAX);
    }
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<String> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const String name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const String& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}